

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void __thiscall TCLAP::Arg::trimFlag(Arg *this,string *flag,string *value)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  string *in_RDX;
  string *in_RSI;
  int i;
  int stop;
  string local_60 [32];
  string local_40 [32];
  uint local_20;
  uint local_1c;
  string *local_18;
  string *local_10;
  
  local_1c = 0;
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    uVar3 = (ulong)local_20;
    uVar4 = std::__cxx11::string::length();
    if (uVar4 <= uVar3) {
LAB_0011bba4:
      if (1 < (int)local_1c) {
        std::__cxx11::string::substr((ulong)local_40,(ulong)local_10);
        std::__cxx11::string::operator=(local_18,local_40);
        std::__cxx11::string::~string(local_40);
        std::__cxx11::string::substr((ulong)local_60,(ulong)local_10);
        std::__cxx11::string::operator=(local_10,local_60);
        std::__cxx11::string::~string(local_60);
      }
      return;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    cVar1 = *pcVar5;
    cVar2 = delimiter();
    if (cVar1 == cVar2) {
      local_1c = local_20;
      goto LAB_0011bba4;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

inline void Arg::trimFlag(std::string& flag, std::string& value) const
{
	int stop = 0;
	for ( int i = 0; static_cast<unsigned int>(i) < flag.length(); i++ )
		if ( flag[i] == Arg::delimiter() )
		{
			stop = i;
			break;
		}

	if ( stop > 1 )
	{
		value = flag.substr(stop+1);
		flag = flag.substr(0,stop);
	}

}